

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall FSliderItem::Drawer(FSliderItem *this,bool selected)

{
  int iVar1;
  int iVar2;
  int iVar3;
  EColorRange local_44;
  int x2;
  int x;
  char *text;
  bool selected_local;
  FSliderItem *this_local;
  
  _x2 = FString::operator_cast_to_char_(&this->mText);
  if (*_x2 == '$') {
    _x2 = FStringTable::operator()(&GStrings,_x2 + 1);
  }
  if (selected) {
    local_44 = OptionSettings.mFontColorSelection;
  }
  else {
    local_44 = this->mFontColor;
  }
  DCanvas::DrawText((DCanvas *)screen,this->mFont,local_44,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,_x2,0x40001390,1
                    ,0);
  iVar1 = FFont::StringWidth(SmallFont,"Green");
  iVar3 = (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
  iVar2 = FFont::StringWidth(SmallFont,_x2);
  iVar3 = MAX<int>(iVar2 + 8 + (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                   iVar1 + 8 + iVar3);
  DrawSlider(this,iVar3,(this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos);
  return;
}

Assistant:

void FSliderItem::Drawer(bool selected)
{
	const char *text = mText;

	if (*text == '$') text = GStrings(text+1);
	screen->DrawText(mFont, selected? OptionSettings.mFontColorSelection : mFontColor, mXpos, mYpos, text, DTA_Clean, true, TAG_DONE);

	int x = SmallFont->StringWidth ("Green") + 8 + mXpos;
	int x2 = SmallFont->StringWidth (text) + 8 + mXpos;
	DrawSlider (MAX(x2, x), mYpos);
}